

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax.cpp
# Opt level: O3

void duckdb::VectorMinMaxBase<(duckdb::OrderType)3>::
     Execute<duckdb::string_t,duckdb::MinMaxStringState,duckdb::MaxOperationVector>
               (MinMaxStringState *state,string_t input,AggregateInputData *input_data)

{
  string_t input_00;
  bool bVar1;
  anon_union_16_2_67f50693_for_value local_18;
  
  local_18.pointer.ptr = (char *)input.value._8_8_;
  local_18._0_8_ = input.value._0_8_;
  if ((state->super_MinMaxState<duckdb::string_t>).isset == false) {
    MinMaxStringState::Assign(state,input);
    (state->super_MinMaxState<duckdb::string_t>).isset = true;
  }
  else {
    bVar1 = string_t::StringComparisonOperators::GreaterThan
                      ((string_t *)state,(string_t *)&local_18.pointer);
    if (bVar1) {
      input_00.value.pointer.ptr = local_18.pointer.ptr;
      input_00.value._0_8_ = local_18._0_8_;
      MinMaxStringState::Assign(state,input_00);
    }
  }
  return;
}

Assistant:

static void Execute(STATE &state, INPUT_TYPE input, AggregateInputData &input_data) {
		if (!state.isset) {
			Assign(state, input, input_data);
			state.isset = true;
			return;
		}
		if (LessThan::Operation<INPUT_TYPE>(input, state.value)) {
			Assign(state, input, input_data);
		}
	}